

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode deleteReference(UA_Server *server,UA_Session *session,UA_DeleteReferencesItem *item)

{
  UA_StatusCode UVar1;
  UA_NodeStoreEntry **ppUVar2;
  UA_DeleteReferencesItem *in_RCX;
  UA_Node *node;
  UA_Node *node_00;
  undefined1 local_88 [72];
  size_t sStack_40;
  UA_Byte *local_38;
  size_t sStack_30;
  UA_Byte *local_28;
  size_t sStack_20;
  
  ppUVar2 = findNode(server->nodestore,(UA_NodeId *)session);
  if (ppUVar2 != (UA_NodeStoreEntry **)0x0) {
    UVar1 = deleteOneWayReference((UA_Server *)&(*ppUVar2)->node,session,node,in_RCX);
    if (UVar1 != 0) {
      return UVar1;
    }
    if ((char)(session->clientDescription).discoveryUrlsSize != '\x01') {
      return 0;
    }
    if (*(int *)&(session->clientDescription).discoveryProfileUri.data != 0) {
      return 0;
    }
    local_28 = (UA_Byte *)0x0;
    sStack_20 = 0;
    local_38 = (UA_Byte *)0x0;
    sStack_30 = 0;
    local_88._48_8_ = (ulong)(byte)(session->clientDescription).applicationName.text.length ^ 1;
    local_88._16_8_ = (session->clientDescription).gatewayServerUri.length;
    local_88._0_8_ = (session->clientDescription).applicationName.text.data;
    local_88._8_8_ = *(undefined8 *)&(session->clientDescription).applicationType;
    sStack_40 = (session->clientDescription).productUri.length;
    local_88._56_8_ = (session->clientDescription).applicationUri.length;
    local_88._64_8_ = (session->clientDescription).applicationUri.data;
    local_88._24_8_ = (session->clientDescription).productUri.data;
    local_88._32_8_ = (session->clientDescription).applicationName.locale.length;
    local_88._40_8_ = (session->clientDescription).applicationName.locale.data;
    ppUVar2 = findNode(server->nodestore,(UA_NodeId *)local_88);
    if (ppUVar2 != (UA_NodeStoreEntry **)0x0) {
      UVar1 = deleteOneWayReference
                        ((UA_Server *)&(*ppUVar2)->node,(UA_Session *)local_88,node_00,in_RCX);
      return UVar1;
    }
  }
  return 0x80340000;
}

Assistant:

static UA_StatusCode
deleteReference(UA_Server *server, UA_Session *session,
                const UA_DeleteReferencesItem *item) {
    UA_StatusCode retval = UA_Server_editNode(server, session, &item->sourceNodeId,
                                              (UA_EditNodeCallback)deleteOneWayReference, item);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;
    if(!item->deleteBidirectional || item->targetNodeId.serverIndex != 0)
        return retval;
    UA_DeleteReferencesItem secondItem;
    UA_DeleteReferencesItem_init(&secondItem);
    secondItem.isForward = !item->isForward;
    secondItem.sourceNodeId = item->targetNodeId.nodeId;
    secondItem.targetNodeId.nodeId = item->sourceNodeId;
    secondItem.referenceTypeId = item->referenceTypeId;
    return UA_Server_editNode(server, session, &secondItem.sourceNodeId,
                              (UA_EditNodeCallback)deleteOneWayReference, &secondItem);
}